

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_a83014::HandleToUpperLowerCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool toUpper,cmExecutionStatus *status)

{
  string_view value;
  undefined8 name;
  cmExecutionStatus *this;
  size_type sVar1;
  const_reference pvVar2;
  cmMakefile *this_00;
  string local_c8;
  string local_a8;
  string local_88 [8];
  string output;
  string *outvar;
  allocator<char> local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool toUpper_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_28 = status;
  status_local._7_1_ = toUpper;
  pvStack_18 = args;
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_28;
  if (sVar1 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"no output variable specified",&local_49);
    cmExecutionStatus::SetError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    args_local._7_1_ = 0;
  }
  else {
    output.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[](pvStack_18,2);
    std::__cxx11::string::string(local_88);
    if ((status_local._7_1_ & 1) == 0) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,1);
      cmsys::SystemTools::LowerCase(&local_c8,pvVar2);
      std::__cxx11::string::operator=(local_88,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_18,1);
      cmsys::SystemTools::UpperCase(&local_a8,pvVar2);
      std::__cxx11::string::operator=(local_88,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    this_00 = cmExecutionStatus::GetMakefile(local_28);
    name = output.field_2._8_8_;
    value = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_88);
    cmMakefile::AddDefinition(this_00,(string *)name,value);
    args_local._7_1_ = 1;
    std::__cxx11::string::~string(local_88);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleToUpperLowerCommand(std::vector<std::string> const& args,
                               bool toUpper, cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("no output variable specified");
    return false;
  }

  std::string const& outvar = args[2];
  std::string output;

  if (toUpper) {
    output = cmSystemTools::UpperCase(args[1]);
  } else {
    output = cmSystemTools::LowerCase(args[1]);
  }

  // Store the output in the provided variable.
  status.GetMakefile().AddDefinition(outvar, output);
  return true;
}